

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O0

void __thiscall
slang::ast::TypePrinter::visit(TypePrinter *this,ScalarType *type,string_view param_2)

{
  string_view *psVar1;
  string_view str;
  pointer pFVar2;
  string_view local_48;
  size_t local_38;
  char *local_30;
  ScalarType *local_28;
  ScalarType *type_local;
  TypePrinter *this_local;
  string_view param_2_local;
  
  param_2_local._M_len = (size_t)param_2._M_str;
  this_local = (TypePrinter *)param_2._M_len;
  local_28 = type;
  type_local = (ScalarType *)this;
  pFVar2 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
           operator->(&this->buffer);
  psVar1 = &(local_28->super_IntegralType).super_Type.super_Symbol.name;
  local_38 = psVar1->_M_len;
  local_30 = (local_28->super_IntegralType).super_Type.super_Symbol.name._M_str;
  str._M_len = psVar1->_M_len;
  str._M_str = psVar1->_M_str;
  FormatBuffer::append(pFVar2,str);
  if (((local_28->super_IntegralType).isSigned & 1U) != 0) {
    pFVar2 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
             operator->(&this->buffer);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48," signed");
    FormatBuffer::append(pFVar2,local_48);
  }
  return;
}

Assistant:

void TypePrinter::visit(const ScalarType& type, string_view) {
    buffer->append(type.name);
    if (type.isSigned)
        buffer->append(" signed");
}